

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void read_string(option_t *opt,int *iarg,int argc,char **argv)

{
  size_t sVar1;
  void *pvVar2;
  long in_RCX;
  int in_EDX;
  int *in_RSI;
  undefined8 *in_RDI;
  char *p;
  size_t size;
  char *local_28;
  
  pvVar2 = *(void **)(in_RCX + (long)*in_RSI * 8);
  sVar1 = strlen((char *)*in_RDI);
  local_28 = (char *)((long)pvVar2 + sVar1);
  if ((*local_28 == '\0') && ((local_28[-1] == '=' || (*in_RSI == in_EDX + -1)))) {
    ccerr(E,"missing %s after \'%s\'",in_RDI[3],*in_RDI);
  }
  else {
    if (*local_28 == '\0') {
      local_28 = *(char **)(in_RCX + (long)(*in_RSI + 1) * 8);
      if (*local_28 == '\0') {
        ccerr(E,"missing %s after \'%s\'",in_RDI[3],*in_RDI);
        return;
      }
      *in_RSI = *in_RSI + 1;
    }
    size = in_RDI[2];
    strlen(local_28);
    pvVar2 = mrealloc(pvVar2,size);
    in_RDI[2] = pvVar2;
    strcpy((char *)in_RDI[2],local_28);
  }
  return;
}

Assistant:

void read_string(option_t* opt, int* iarg, int argc, char** argv)
{
    char *p = argv[*iarg] + strlen(opt->name);

    /* Option names not terminated with '=' can have their paramater defined
    by the next argument. */
    if (!*p && (*(p-1) == '=' || *iarg == argc - 1))
    {
        ccerr(E, "missing %s after '%s'", opt->argname, opt->name);
        return;
    }

    if (!*p)
    {
        p = argv[*iarg + 1];
        if (!*p)
        {
            ccerr(E, "missing %s after '%s'", opt->argname, opt->name);
            return;
        }
        ++*iarg;
    }

    opt->value.str = (char*)mrealloc(opt->value.str, strlen(p) + 1);
    strcpy(opt->value.str, p);
}